

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::Print(QueryProfiler *this)

{
  string sStack_28;
  
  QueryTreeToString_abi_cxx11_(&sStack_28,this);
  Printer::Print(&sStack_28);
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void QueryProfiler::Print() {
	Printer::Print(QueryTreeToString());
}